

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

Client * __thiscall
capnp::DynamicCapability::Client::as<capnproto_test::capnp::test::TestInterface,void>
          (Client *__return_storage_ptr__,Client *this)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> local_28;
  Client *local_18;
  Client *this_local;
  
  local_18 = this;
  this_local = (Client *)__return_storage_ptr__;
  Schema::requireUsableAs<capnproto_test::capnp::test::TestInterface>(&(this->schema).super_Schema);
  pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)this);
  (*pCVar1->_vptr_ClientHook[4])(&local_28);
  capnproto_test::capnp::test::TestInterface::Client::Client(__return_storage_ptr__,&local_28);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client DynamicCapability::Client::as() {
  static_assert(kind<T>() == Kind::INTERFACE,
                "DynamicCapability::Client::as<T>() can only convert to interface types.");
  schema.requireUsableAs<T>();
  return typename T::Client(hook->addRef());
}